

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O0

void __thiscall ser::CentralizedFileFormat::ImportTables(CentralizedFileFormat *this)

{
  FieldsTable *this_00;
  OffsetTable *this_01;
  bool bVar1;
  char *pcVar2;
  streamoff sVar3;
  JSONNode *pJVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  exception *anon_var_0;
  json_string local_2f8;
  allocator local_2d1;
  json_string local_2d0;
  allocator local_2a9;
  json_string local_2a8;
  JSONNode local_288;
  JSONNode node;
  undefined4 local_278;
  undefined1 local_270 [12];
  uint local_25c;
  fpos local_258 [16];
  int local_248;
  int fileLength;
  undefined1 local_238 [8];
  string json_txt;
  ifstream fs;
  CentralizedFileFormat *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&json_txt.field_2._M_allocated_capacity + 1,pcVar2,_S_in);
  std::__cxx11::string::string((string *)local_238);
  std::istream::seekg((long)(&json_txt.field_2._M_allocated_capacity + 1),_S_beg);
  local_258 = (fpos  [16])std::istream::tellg();
  sVar3 = std::fpos::operator_cast_to_long(local_258);
  local_248 = (int)sVar3;
  bVar1 = 0 < local_248;
  if (bVar1) {
    std::__cxx11::string::reserve((ulong)local_238);
    std::istream::seekg((long)((long)&json_txt.field_2 + 8),_S_beg);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_270,
               (istream_type *)(json_txt.field_2._M_local_buf + 8));
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)&node);
    __first._12_4_ = 0;
    __first._M_sbuf = (streambuf_type *)local_270._0_8_;
    __first._M_c = local_270._8_4_;
    __last._12_4_ = 0;
    __last._M_sbuf = (streambuf_type *)node.internal;
    __last._M_c = local_278;
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)local_238,__first,__last);
    std::ifstream::close();
    libjson::parse((libjson *)&local_288,(json_string *)local_238);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"GlobalMetainfo",&local_2a9);
    pJVar4 = ::JSONNode::operator[](&local_288,&local_2a8);
    GlobalInfoFromJSON(this,pJVar4);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    this_00 = (this->super_FileFormat).pFieldsTable_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d0,"FieldsTable",&local_2d1);
    pJVar4 = ::JSONNode::operator[](&local_288,&local_2d0);
    FieldsTable::TableFromJSON(this_00,pJVar4);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    this_01 = (this->super_FileFormat).pOffsetTable_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2f8,"OffsetTable",(allocator *)((long)&anon_var_0 + 7));
    pJVar4 = ::JSONNode::operator[](&local_288,&local_2f8);
    OffsetTable::TableFromJSON(this_01,pJVar4);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    ::JSONNode::~JSONNode(&local_288);
  }
  else {
    std::ifstream::close();
    MetainfoSet::Cleanup((this->super_FileFormat).pGlobalMetainfo_);
    FieldsTable::Cleanup((this->super_FileFormat).pFieldsTable_);
    OffsetTable::Cleanup((this->super_FileFormat).pOffsetTable_);
  }
  local_25c = (uint)!bVar1;
  std::__cxx11::string::~string((string *)local_238);
  std::ifstream::~ifstream((void *)((long)&json_txt.field_2 + 8));
  return;
}

Assistant:

void CentralizedFileFormat::ImportTables()
{
    // Open database file and get length
    std::ifstream fs(databaseFile_.c_str());
    std::string json_txt;
    fs.seekg(0, std::ios::end);
    int fileLength = fs.tellg();

    // If file length is 0, then do not interpret JSON and clean the tables
    if (fileLength <= 0)
    {
        fs.close();

        pGlobalMetainfo_->Cleanup();
        pFieldsTable_->Cleanup();
        pOffsetTable_->Cleanup();
        return;
    }

    // Read json
    json_txt.reserve(fileLength);
    fs.seekg(0, std::ios::beg);
    json_txt.assign((std::istreambuf_iterator<char>(fs)), std::istreambuf_iterator<char>());
    fs.close();

    // Interpret JSON
    try
    {
        JSONNode node = libjson::parse(json_txt);

        GlobalInfoFromJSON(node["GlobalMetainfo"]);
        pFieldsTable_->TableFromJSON(node["FieldsTable"]);
        pOffsetTable_->TableFromJSON(node["OffsetTable"]);
    }
    catch(std::exception&)
    {
        std::cerr << "Error: JSON code in file " << databaseFile_ << " is malformed.\n"
                  << "Unable to read data.\n";
        std::exit(1);
    }
}